

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O3

void BrotliSplitBlockCommandsFromStored
               (MemoryManager *m,Command_conflict *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *cmd_split,BlockSplitFromDecoder *cmd_split_decoder,
               size_t *cur_block_decoder)

{
  size_t __size;
  uint8_t *__dest;
  ulong uVar1;
  uint32_t *puVar2;
  void *__s;
  ulong uVar3;
  size_t sVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar11 = cmd_split->types_alloc_size;
  uVar1 = cmd_split_decoder->num_blocks;
  if (uVar11 < uVar1) {
    if (uVar11 == 0) {
      uVar11 = uVar1;
    }
    do {
      uVar3 = uVar11;
      uVar11 = uVar3 * 2;
    } while (uVar3 < uVar1);
    __dest = (uint8_t *)BrotliAllocate(m,uVar3);
    if (cmd_split->types_alloc_size != 0) {
      memcpy(__dest,cmd_split->types,cmd_split->types_alloc_size);
    }
    BrotliFree(m,cmd_split->types);
    cmd_split->types = __dest;
    cmd_split->types_alloc_size = uVar3;
    uVar1 = cmd_split_decoder->num_blocks;
  }
  uVar11 = cmd_split->lengths_alloc_size;
  if (uVar11 < uVar1) {
    if (uVar11 == 0) {
      uVar11 = uVar1;
    }
    do {
      uVar3 = uVar11;
      uVar11 = uVar3 * 2;
    } while (uVar3 < uVar1);
    puVar2 = (uint32_t *)BrotliAllocate(m,uVar3 * 4);
    if (cmd_split->lengths_alloc_size != 0) {
      memcpy(puVar2,cmd_split->lengths,cmd_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,cmd_split->lengths);
    cmd_split->lengths = puVar2;
    cmd_split->lengths_alloc_size = uVar3;
  }
  cmd_split->num_types = 0;
  cmd_split->num_blocks = 0;
  sVar8 = cmd_split_decoder->num_types;
  __size = sVar8 * 4;
  __s = malloc(__size);
  if (sVar8 != 0) {
    memset(__s,0xff,__size);
  }
  if (num_commands != 0) {
    puVar2 = cmd_split_decoder->positions_end;
    sVar4 = 0;
    lVar6 = 0;
    sVar8 = *cur_block_decoder;
    do {
      uVar11 = (ulong)puVar2[sVar8];
      sVar9 = sVar8;
      if ((uVar11 <= pos) && (lVar6 != 0)) {
        uVar10 = *(uint *)((long)__s + (ulong)cmd_split_decoder->types[sVar8] * 4);
        if (uVar10 == 0xffffffff) {
          uVar10 = (uint)cmd_split->num_types;
          *(uint *)((long)__s + (ulong)cmd_split_decoder->types[sVar8] * 4) = uVar10;
        }
        sVar9 = cmd_split->num_blocks;
        if ((sVar9 == 0) || (uVar10 != cmd_split->types[sVar9 - 1])) {
          cmd_split->types[sVar9] = (uint8_t)uVar10;
          sVar8 = cmd_split->num_blocks;
          cmd_split->lengths[sVar8] = (uint32_t)lVar6;
          uVar10 = (uint)cmd_split->num_types;
          bVar5 = cmd_split->types[sVar8] + 1;
          uVar7 = (uint)bVar5;
          if (bVar5 < (byte)uVar10) {
            uVar7 = uVar10;
          }
          cmd_split->num_types = (ulong)(uVar7 & 0xff);
          cmd_split->num_blocks = sVar8 + 1;
          sVar8 = *cur_block_decoder;
          puVar2 = cmd_split_decoder->positions_end;
        }
        else {
          cmd_split->lengths[sVar9 - 1] = cmd_split->lengths[sVar9 - 1] + (uint32_t)lVar6;
        }
        sVar9 = sVar8 + 1;
        *cur_block_decoder = sVar9;
        uVar11 = (ulong)puVar2[sVar8 + 1];
        lVar6 = 0;
      }
      if (uVar11 <= pos) {
        do {
          lVar6 = sVar9 + 1;
          sVar9 = sVar9 + 1;
        } while (puVar2[lVar6] <= pos);
        *cur_block_decoder = sVar9;
        lVar6 = 0;
      }
      lVar6 = (lVar6 + 1) - (ulong)(pos < cmd_split_decoder->positions_begin[sVar9]);
      pos = pos + ((cmds[sVar4].copy_len_ & 0x1ffffff) + cmds[sVar4].insert_len_);
      sVar4 = sVar4 + 1;
      sVar8 = sVar9;
    } while (sVar4 != num_commands);
    if (lVar6 != 0) {
      uVar10 = *(uint *)((long)__s + (ulong)cmd_split_decoder->types[*cur_block_decoder] * 4);
      if (uVar10 == 0xffffffff) {
        uVar10 = (uint)cmd_split->num_types;
      }
      sVar8 = cmd_split->num_blocks;
      if ((sVar8 == 0) || (uVar10 != cmd_split->types[sVar8 - 1])) {
        cmd_split->types[sVar8] = (uint8_t)uVar10;
        sVar8 = cmd_split->num_blocks;
        cmd_split->lengths[sVar8] = (uint32_t)lVar6;
        uVar10 = (uint)cmd_split->num_types;
        bVar5 = cmd_split->types[sVar8] + 1;
        uVar7 = (uint)bVar5;
        if (bVar5 < (byte)uVar10) {
          uVar7 = uVar10;
        }
        cmd_split->num_types = (ulong)(uVar7 & 0xff);
        cmd_split->num_blocks = sVar8 + 1;
      }
      else {
        cmd_split->lengths[sVar8 - 1] = cmd_split->lengths[sVar8 - 1] + (uint32_t)lVar6;
      }
    }
  }
  return;
}

Assistant:

void BrotliSplitBlockCommandsFromStored(
                        MemoryManager* m,
                        const Command* cmds,
                        const size_t num_commands,
                        const size_t pos,
                        const size_t mask,
                        BlockSplit* cmd_split,
                        const BlockSplitFromDecoder* cmd_split_decoder,
                        size_t* cur_block_decoder) {
    BROTLI_ENSURE_CAPACITY(
        m, uint8_t, cmd_split->types, cmd_split->types_alloc_size,
        cmd_split_decoder->num_blocks);
    BROTLI_ENSURE_CAPACITY(
        m, uint32_t, cmd_split->lengths, cmd_split->lengths_alloc_size,
        cmd_split_decoder->num_blocks);
    size_t cur_pos = pos;
    cmd_split->num_blocks = 0;
    cmd_split->num_types = 0;
    size_t cur_length = 0;
    /* Mapping of the types from decoder (they increase with each metablock)
       to the appropriate types */
    int* types_mapping = (int*)malloc(sizeof(int) * cmd_split_decoder->num_types);
    for (int i = 0; i < cmd_split_decoder->num_types; ++i) {
      types_mapping[i] = -1;
    }
    for (int i = 0; i < num_commands; ++i) {
      const Command cmd = cmds[i];
      /* If current command lies after the current block
         that means we've finished the current block.
         If some commands have fallen inside current block before
         then need to save it*/
      if (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder] &&
            cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                          cmd_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (cmd_split->num_blocks > 0 &&
            types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
              cmd_split->types[cmd_split->num_blocks - 1]) {
            cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          cmd_split->types[cmd_split->num_blocks] =
                    types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
          cmd_split->lengths[cmd_split->num_blocks] = cur_length;
          cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                  cmd_split->types[cmd_split->num_blocks] + 1);
          cmd_split->num_blocks++;
        }
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* Go through decoder blocks until a block with cur_pos inside is found */
      while (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* If command lies inside current block then
         increase an amount of commands inside current block*/
      if (cur_pos >= cmd_split_decoder->positions_begin[*cur_block_decoder] &&
          cur_pos < cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length++;
      } else {
        // TODO: log that back refs are wrong
      }
      /* Shift cur_pos by the amount of symbols representing a command */
      cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
    }
    /* Save the last in metablock block */
    if (cur_length > 0) {
      if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
        types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                            cmd_split->num_types;
      }
      /* If the same block type as for a previous block then merge them */
      if (cmd_split->num_blocks > 0 &&
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
            cmd_split->types[cmd_split->num_blocks - 1]) {
          cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
      } else {
        cmd_split->types[cmd_split->num_blocks] =
                      types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
        cmd_split->lengths[cmd_split->num_blocks] = cur_length;
        cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                      cmd_split->types[cmd_split->num_blocks] + 1);
        cmd_split->num_blocks++;
      }
    }
}